

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  ClassNameResolver *this_00;
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FieldDescriptor *pFVar6;
  Descriptor *pDVar7;
  ImmutableFieldGenerator *pIVar8;
  FileDescriptor *descriptor;
  OneofGeneratorInfo *pOVar9;
  char *pcVar10;
  int index;
  Descriptor *descriptor_00;
  iterator iVar11;
  undefined1 auVar12 [16];
  string_view s;
  string_view s_00;
  string_view local_400;
  string_view local_3f0;
  string_view local_3e0;
  string_view local_3d0;
  string_view local_3c0;
  undefined1 local_3b0 [16];
  string local_3a0;
  string_view local_380;
  string_view local_370;
  string_view local_360;
  string_view local_350;
  string local_340;
  string_view local_320;
  FieldDescriptor *local_310;
  FieldDescriptor *field;
  undefined1 auStack_300 [4];
  int j;
  OneofDescriptor *local_2f0;
  OneofDescriptor *oneof;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv_1;
  int local_2d8;
  undefined1 local_2d0 [8];
  iterator __end4;
  undefined1 local_2b0 [8];
  iterator __begin4;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range4;
  undefined1 local_290 [4];
  int i_4;
  string_view local_270;
  string local_260;
  string_view local_240;
  string local_230;
  string_view local_210;
  string local_200;
  string_view local_1e0;
  string local_1d0;
  string local_1b0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  reference local_160;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_150;
  undefined1 local_148 [8];
  iterator __end3;
  undefined1 local_128 [8];
  iterator __begin3;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3;
  undefined1 local_108 [4];
  int i_3;
  string_view local_e8;
  uint local_d8;
  int local_d4;
  int i_2;
  int totalBuilderInts;
  string_view local_c0;
  int local_ac;
  undefined1 auStack_a8 [4];
  int i_1;
  string local_98;
  string_view local_78 [2];
  string local_58;
  string_view local_38;
  char *local_28;
  char *force_builder_init;
  int i;
  bool need_maybe_force_builder_init;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  force_builder_init._7_1_ = 0;
  force_builder_init._0_4_ = 0;
  _i = printer;
  printer_local = (Printer *)this;
  do {
    iVar4 = (int)force_builder_init;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar4) {
LAB_003fe9b5:
      pPVar1 = _i;
      local_28 = "";
      if ((force_builder_init._7_1_ & 1) != 0) {
        local_28 = "  maybeForceBuilderInitialization();";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_38,
                 "// Construct using $classname$.newBuilder()\nprivate Builder() {\n$force_builder_init$\n}\n\n"
                );
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_58,this->name_resolver_,this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
                (pPVar1,local_38,(char (*) [10])0xa117a7,&local_58,
                 (char (*) [19])"force_builder_init",&local_28);
      std::__cxx11::string::~string((string *)&local_58);
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_78,
                 "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n$force_builder_init$\n}\n"
                );
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_98,this->name_resolver_,this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
                (pPVar1,local_78[0],(char (*) [10])0xa117a7,&local_98,
                 (char (*) [19])"force_builder_init",&local_28);
      std::__cxx11::string::~string((string *)&local_98);
      pPVar1 = _i;
      if ((force_builder_init._7_1_ & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a8,
                   "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage\n          .alwaysUseFieldBuilders) {\n"
                  );
        io::Printer::Print<>(pPVar1,_auStack_a8);
        io::Printer::Indent(_i);
        io::Printer::Indent(_i);
        for (local_ac = 0; iVar4 = local_ac, iVar3 = Descriptor::field_count(this->descriptor_),
            iVar4 < iVar3; local_ac = local_ac + 1) {
          pFVar6 = Descriptor::field(this->descriptor_,local_ac);
          bVar2 = IsRealOneof(pFVar6);
          if (!bVar2) {
            pFVar6 = Descriptor::field(this->descriptor_,local_ac);
            pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(&this->field_generators_,pFVar6);
            (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[0x10])(pIVar8,_i);
          }
        }
        io::Printer::Outdent(_i);
        io::Printer::Outdent(_i);
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_c0,"  }\n}\n");
        io::Printer::Print<>(pPVar1,local_c0);
      }
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&i_2,
                 "@java.lang.Override\npublic Builder clear() {\n  super.clear();\n");
      io::Printer::Print<>(pPVar1,_i_2);
      io::Printer::Indent(_i);
      iVar4 = Descriptor::field_count(this->descriptor_);
      local_d4 = (iVar4 + 0x1f) / 0x20;
      for (local_d8 = 0; pPVar1 = _i, (int)local_d8 < local_d4; local_d8 = local_d8 + 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_e8,"$bit_field_name$ = 0;\n");
        GetBitFieldName_abi_cxx11_((string *)local_108,(java *)(ulong)local_d8,index);
        io::Printer::Print<char[15],std::__cxx11::string>
                  (pPVar1,local_e8,(char (*) [15])"bit_field_name",(string *)local_108);
        std::__cxx11::string::~string((string *)local_108);
      }
      for (__range3._4_4_ = 0; iVar4 = Descriptor::field_count(this->descriptor_),
          __range3._4_4_ < iVar4; __range3._4_4_ = __range3._4_4_ + 1) {
        pFVar6 = Descriptor::field(this->descriptor_,__range3._4_4_);
        pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,pFVar6);
        (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[0xb])(pIVar8,_i);
      }
      __begin3._8_8_ = &this->oneofs_;
      iVar11 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                        *)__begin3._8_8_);
      __end3._8_8_ = iVar11.node_;
      __begin3.node_._0_4_ = iVar11.position_;
      local_128 = (undefined1  [8])__end3._8_8_;
      iVar11 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                      *)__begin3._8_8_);
      kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar11.node_;
      local_150 = iVar11.position_;
      local_148 = (undefined1  [8])kv;
      __end3.node_._0_4_ = local_150;
      while (bVar2 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                   *)local_128,(iterator *)local_148), bVar2) {
        local_160 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                 *)local_128);
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_170,"$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n");
        pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_160->second);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (pPVar1,local_170,(char (*) [11])0xa82482,&pOVar9->name);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                      *)local_128);
      }
      io::Printer::Outdent(_i);
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_180,"  return this;\n}\n\n");
      io::Printer::Print<>(pPVar1,local_180);
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_190,
                 "@java.lang.Override\npublic com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                );
      this_00 = this->name_resolver_;
      descriptor = Descriptor::file(this->descriptor_);
      ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
                (&local_1b0,this_00,descriptor);
      UniqueFileScopeIdentifier_abi_cxx11_(&local_1d0,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
                (pPVar1,local_190,(char (*) [10])"fileclass",&local_1b0,(char (*) [11])0xa28a0f,
                 &local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1e0,
                 "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                );
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_200,this->name_resolver_,this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string>
                (pPVar1,local_1e0,(char (*) [10])0xa117a7,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      pPVar1 = _i;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_210,
                 "@java.lang.Override\npublic $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
                );
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_230,this->name_resolver_,this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string>
                (pPVar1,local_210,(char (*) [10])0xa117a7,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      GenerateBuildPartial(this,_i);
      bVar2 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
      pPVar1 = _i;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_240,
                   "@java.lang.Override\npublic Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                  );
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  (&local_260,this->name_resolver_,this->descriptor_);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (pPVar1,local_240,(char (*) [10])0xa117a7,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_270,
                   "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                  );
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  ((string *)local_290,this->name_resolver_,this->descriptor_);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (pPVar1,local_270,(char (*) [10])0xa117a7,(string *)local_290);
        std::__cxx11::string::~string((string *)local_290);
        io::Printer::Indent(_i);
        for (__range4._4_4_ = 0; iVar4 = Descriptor::field_count(this->descriptor_),
            __range4._4_4_ < iVar4; __range4._4_4_ = __range4._4_4_ + 1) {
          pFVar6 = Descriptor::field(this->descriptor_,__range4._4_4_);
          bVar2 = IsRealOneof(pFVar6);
          if (!bVar2) {
            pFVar6 = Descriptor::field(this->descriptor_,__range4._4_4_);
            pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(&this->field_generators_,pFVar6);
            (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar8,_i);
          }
        }
        __begin4._8_8_ = &this->oneofs_;
        iVar11 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                 ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                          *)__begin4._8_8_);
        __end4._8_8_ = iVar11.node_;
        __begin4.node_._0_4_ = iVar11.position_;
        local_2b0 = (undefined1  [8])__end4._8_8_;
        iVar11 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                 ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                        *)__begin4._8_8_);
        kv_1 = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar11.node_;
        local_2d8 = iVar11.position_;
        local_2d0 = (undefined1  [8])kv_1;
        __end4.node_._0_4_ = local_2d8;
        while( true ) {
          bVar2 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                *)local_2b0,(iterator *)local_2d0);
          if (!bVar2) break;
          oneof = (OneofDescriptor *)
                  absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)local_2b0);
          pPVar1 = _i;
          local_2f0 = (OneofDescriptor *)(oneof->all_names_).payload_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_300,
                     "switch (other.get$oneof_capitalized_name$Case()) {\n");
          pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_2f0);
          io::Printer::Print<char[23],std::__cxx11::string>
                    (pPVar1,_auStack_300,(char (*) [23])"oneof_capitalized_name",
                     &pOVar9->capitalized_name);
          io::Printer::Indent(_i);
          field._4_4_ = 0;
          while( true ) {
            iVar4 = field._4_4_;
            uVar5 = OneofDescriptor::field_count(local_2f0);
            pPVar1 = _i;
            pcVar10 = (char *)(ulong)uVar5;
            if ((int)uVar5 <= iVar4) break;
            local_310 = OneofDescriptor::field(local_2f0,field._4_4_);
            pPVar1 = _i;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_320,"case $field_name$: {\n");
            local_350 = FieldDescriptor::name(local_310);
            s._M_str = pcVar10;
            s._M_len = (size_t)local_350._M_str;
            absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
                      (&local_340,(lts_20250127 *)local_350._M_len,s);
            io::Printer::Print<char[11],std::__cxx11::string>
                      (pPVar1,local_320,(char (*) [11])0xaa5115,&local_340);
            std::__cxx11::string::~string((string *)&local_340);
            io::Printer::Indent(_i);
            pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(&this->field_generators_,local_310);
            (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar8,_i);
            pPVar1 = _i;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_360,"break;\n");
            io::Printer::Print<>(pPVar1,local_360);
            io::Printer::Outdent(_i);
            pPVar1 = _i;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_370,"}\n");
            io::Printer::Print<>(pPVar1,local_370);
            field._4_4_ = field._4_4_ + 1;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_380,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n");
          pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_2f0);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pOVar9);
          s_00._M_len = auVar12._8_8_;
          s_00._M_str = pcVar10;
          local_3b0 = auVar12;
          absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_3a0,auVar12._0_8_,s_00);
          io::Printer::Print<char[15],std::__cxx11::string>
                    (pPVar1,local_380,(char (*) [15])"cap_oneof_name",&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          io::Printer::Outdent(_i);
          pPVar1 = _i;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3c0,"}\n")
          ;
          io::Printer::Print<>(pPVar1,local_3c0);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                        *)local_2b0);
        }
        io::Printer::Outdent(_i);
        iVar4 = Descriptor::extension_range_count(this->descriptor_);
        pPVar1 = _i;
        if (0 < iVar4) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_3d0,"  this.mergeExtensionFields(other);\n");
          io::Printer::Print<>(pPVar1,local_3d0);
        }
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3e0,"  this.mergeUnknownFields(other.getUnknownFields());\n");
        io::Printer::Print<>(pPVar1,local_3e0);
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_3f0,"  onChanged();\n");
        io::Printer::Print<>(pPVar1,local_3f0);
        pPVar1 = _i;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_400,"  return this;\n}\n\n");
        io::Printer::Print<>(pPVar1,local_400);
      }
      return;
    }
    pFVar6 = Descriptor::field(this->descriptor_,(int)force_builder_init);
    pDVar7 = FieldDescriptor::message_type(pFVar6);
    if (pDVar7 != (Descriptor *)0x0) {
      pFVar6 = Descriptor::field(this->descriptor_,(int)force_builder_init);
      bVar2 = IsRealOneof(pFVar6);
      if (!bVar2) {
        pFVar6 = Descriptor::field(this->descriptor_,(int)force_builder_init);
        bVar2 = HasHasbit(pFVar6);
        if (bVar2) {
          force_builder_init._7_1_ = 1;
          goto LAB_003fe9b5;
        }
      }
    }
    force_builder_init._0_4_ = (int)force_builder_init + 1;
  } while( true );
}

Assistant:

void MessageBuilderGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  // Decide if we really need to have the "maybeForceBuilderInitialization()"
  // method.
  // TODO: Remove the need for this entirely
  bool need_maybe_force_builder_init = false;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->message_type() != nullptr &&
        !IsRealOneof(descriptor_->field(i)) &&
        HasHasbit(descriptor_->field(i))) {
      need_maybe_force_builder_init = true;
      break;
    }
  }

  const char* force_builder_init = need_maybe_force_builder_init
                                       ? "  maybeForceBuilderInitialization();"
                                       : "";

  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "$force_builder_init$\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "$force_builder_init$\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  if (need_maybe_force_builder_init) {
    printer->Print(
        "private void maybeForceBuilderInitialization() {\n"
        "  if (com.google.protobuf.GeneratedMessage\n"
        "          .alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateFieldBuilderInitializationCode(printer);
      }
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "}\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "public Builder clear() {\n"
      "  super.clear();\n");

  printer->Indent();
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  for (auto& kv : oneofs_) {
    printer->Print(
        "$oneof_name$Case_ = 0;\n"
        "$oneof_name$_ = null;\n",
        "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
  }

  printer->Outdent();

  printer->Print(
      "  return this;\n"
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return $classname$.getDefaultInstance();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ build() {\n"
      "  $classname$ result = buildPartial();\n"
      "  if (!result.isInitialized()) {\n"
      "    throw newUninitializedMessageException(result);\n"
      "  }\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateBuildPartial(printer);

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "@java.lang.Override\n"
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
        "public Builder mergeFrom($classname$ other) {\n"
        // Optimization:  If other is the default instance, we know none of its
        //   fields are set so we can skip the merge.
        "  if (other == $classname$.getDefaultInstance()) return this;\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print("switch (other.get$oneof_capitalized_name$Case()) {\n",
                     "oneof_capitalized_name",
                     context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
      printer->Indent();
      for (int j = 0; j < oneof->field_count(); j++) {
        const FieldDescriptor* field = oneof->field(j);
        printer->Print("case $field_name$: {\n", "field_name",
                       absl::AsciiStrToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print("break;\n");
        printer->Outdent();
        printer->Print("}\n");
      }
      printer->Print(
          "case $cap_oneof_name$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          "cap_oneof_name",
          absl::AsciiStrToUpper(context_->GetOneofGeneratorInfo(oneof)->name));
      printer->Outdent();
      printer->Print("}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("  this.mergeExtensionFields(other);\n");
    }

    printer->Print("  this.mergeUnknownFields(other.getUnknownFields());\n");

    printer->Print("  onChanged();\n");

    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }
}